

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_resilience_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_39a821::ErrorResilienceTestLarge_DropFramesWithoutRecovery_Test::
~ErrorResilienceTestLarge_DropFramesWithoutRecovery_Test
          (ErrorResilienceTestLarge_DropFramesWithoutRecovery_Test *this)

{
  void *in_RDI;
  
  ~ErrorResilienceTestLarge_DropFramesWithoutRecovery_Test
            ((ErrorResilienceTestLarge_DropFramesWithoutRecovery_Test *)0x524a58);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(ErrorResilienceTestLarge, DropFramesWithoutRecovery) {
  if (GET_PARAM(1) == ::libaom_test::kOnePassGood && GET_PARAM(2) == 1) {
    fprintf(stderr, "Skipping test case #1 because of bug aomedia:3002\n");
    return;
  }
  SetupEncoder(500, 10);
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     cfg_.g_timebase.den, cfg_.g_timebase.num,
                                     0, 20);

  // Set an arbitrary set of error frames same as droppable frames.
  unsigned int num_droppable_frames = 3;
  unsigned int droppable_frame_list[] = { 5, 11, 13 };
  SetDroppableFrames(num_droppable_frames, droppable_frame_list);
  SetErrorFrames(num_droppable_frames, droppable_frame_list);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  // Test that no mismatches have been found
  std::cout << "             Encoded frames: " << GetEncodedFrames() << "\n";
  std::cout << "             Decoded frames: " << GetDecodedFrames() << "\n";
  std::cout << "             Mismatch frames: " << GetMismatchFrames() << "\n";
  EXPECT_EQ(GetEncodedFrames() - GetDecodedFrames(), num_droppable_frames);
}